

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

void recff_cdata_arith(jit_State *J,RecordFFData *rd)

{
  CType *pCVar1;
  TValue *pTVar2;
  ushort uVar3;
  IRType IVar4;
  TRef TVar5;
  CTSize CVar6;
  TRef TVar7;
  CTypeID CVar8;
  GCcdata *pGVar9;
  CType *pCVar10;
  cTValue *pcVar11;
  ulong uVar12;
  ushort uVar13;
  ushort uVar14;
  uint uVar15;
  ulong uVar16;
  IRRef1 IVar17;
  int32_t iVar18;
  CTState *pCVar19;
  GCobj *o;
  long lVar20;
  TRef tr;
  IRRef1 IVar21;
  uint uVar22;
  uint *puVar23;
  bool bVar24;
  TRef sp [2];
  CType *s [2];
  CTSize ofs;
  uint local_80;
  uint local_7c;
  CTState *local_78;
  uint local_6c;
  jit_State *local_68;
  RecordFFData *local_60;
  uint *local_58 [3];
  uint local_40;
  CTSize local_3c;
  ulong local_38;
  
  pCVar19 = (CTState *)(ulong)*(uint *)((ulong)(J->L->glref).ptr32 + 0x194);
  pCVar19->L = J->L;
  local_6c = rd->data;
  local_40 = local_6c & 0xfffffffc;
  uVar12 = 0;
  local_78 = pCVar19;
  local_68 = J;
  local_60 = rd;
  do {
    uVar22 = J->base[uVar12];
    if (uVar22 == 0) goto LAB_0015a7b2;
    uVar15 = uVar22 & 0x1f000000;
    if (uVar15 == 0) {
      if (local_40 != 4) goto LAB_0015a7b2;
      uVar22 = lj_ir_kptr_(J,IR_KPTR,(void *)0x0);
      pCVar10 = pCVar19->tab + 0x11;
    }
    else {
      IVar17 = (IRRef1)uVar22;
      if (uVar15 == 0xa000000) {
        pGVar9 = argv2cdata(J,uVar22,local_60->argv + uVar12);
        local_38 = (ulong)pGVar9->ctypeid;
        pCVar1 = pCVar19->tab;
        uVar22 = pCVar1[local_38].info;
        pCVar10 = pCVar1 + local_38;
        IVar4 = crec_ct2irt(pCVar19,pCVar10);
        puVar23 = local_58[0];
        J = local_68;
        uVar22 = uVar22 >> 0x1c;
        uVar3 = (ushort)IVar4;
        if (uVar22 == 2) {
          (local_68->fold).ins.field_0.ot = uVar3 | 0x4400;
          (local_68->fold).ins.field_0.op1 = IVar17;
          (local_68->fold).ins.field_0.op2 = 0xf;
          uVar22 = lj_opt_fold(local_68);
          if ((pCVar10->info & 0xf0800000) == 0x20800000) {
            pCVar10 = local_78->tab + (ushort)pCVar10->info;
            IVar4 = crec_ct2irt(local_78,pCVar10);
          }
LAB_00159ccf:
          if ((pCVar10->info & 0xf0000000) == 0x50000000) {
            pCVar10 = (CType *)((long)&local_78->tab->info + (ulong)((pCVar10->info & 0xffff) << 4))
            ;
          }
          pCVar19 = local_78;
          if (pCVar10->info < 0x10000000) {
            if (IVar4 != IRT_CDATA) {
              (J->fold).ins.field_0.ot = (ushort)IVar4 | 0x4500;
              (J->fold).ins.field_0.op1 = (IRRef1)uVar22;
              (J->fold).ins.field_0.op2 = 0;
              goto LAB_00159f32;
            }
            uVar22 = 0;
          }
        }
        else if (IVar4 - IRT_I64 < 2) {
          (local_68->fold).ins.field_0.ot = uVar3 | 0x4400;
          (local_68->fold).ins.field_0.op1 = IVar17;
          (local_68->fold).ins.field_0.op2 = 0x11;
LAB_00159f32:
          uVar22 = lj_opt_fold(J);
          pCVar19 = local_78;
        }
        else if (IVar4 - IRT_IGC < 2) {
          (local_68->fold).ins.field_0.ot = uVar3 | 0x4400;
          (local_68->fold).ins.field_0.op1 = IVar17;
          (local_68->fold).ins.field_0.op2 = 0x10;
          uVar22 = lj_opt_fold(local_68);
          pCVar19 = local_78;
          if ((pCVar10->info & 0xf0000000) == 0x50000000) {
            pCVar10 = (CType *)((long)&local_78->tab->info + (ulong)((pCVar10->info & 0xffff) << 4))
            ;
          }
        }
        else {
          if (uVar22 != 6) {
            TVar5 = lj_ir_kint64(local_68,8);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar17;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
            uVar22 = lj_opt_fold(J);
            goto LAB_00159ccf;
          }
          (local_68->fold).ins.field_0.op1 = IVar17;
          *(undefined4 *)((long)&(local_68->fold).ins.field_1.op12 + 2) = 0x4409000f;
          uVar22 = lj_opt_fold(local_68);
          pCVar19 = local_78;
          CVar8 = lj_ctype_intern(local_78,(uint)local_38 | 0x20030000,8);
          pCVar10 = pCVar19->tab + CVar8;
          J = local_68;
          if (uVar12 != 0) {
            local_58[0] = (uint *)((long)&pCVar19->tab->info +
                                  ((long)puVar23 - (long)pCVar1 & 0xffffffff0U));
          }
        }
      }
      else {
        pCVar10 = pCVar19->tab;
        if ((uVar22 >> 0x18 & 0x1f) - 0xf < 5) {
          pCVar10 = pCVar10 + 9;
        }
        else if (uVar15 == 0xe000000) {
          pCVar10 = pCVar10 + 0xe;
        }
        else if (uVar15 == 0x4000000) {
          uVar16 = uVar12 & 0xffffffff ^ 1;
          pGVar9 = argv2cdata(J,J->base[uVar16],local_60->argv + uVar16);
          pCVar10 = pCVar19->tab + pGVar9->ctypeid;
          uVar22 = pCVar19->tab[pGVar9->ctypeid].info >> 0x1c;
          if (uVar22 == 2) {
            TVar5 = lj_ir_kint64(J,0x10);
            (J->fold).ins.field_0.ot = 0x2909;
            (J->fold).ins.field_0.op1 = IVar17;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
            uVar22 = lj_opt_fold(J);
          }
          else {
            if (uVar22 != 5) goto LAB_0015a7b2;
            o = (GCobj *)(ulong)local_60->argv[uVar12].u32.lo;
            pCVar10 = lj_ctype_getfieldq(local_78,pCVar10,&o->str,&local_3c,(CTInfo *)0x0);
            if ((pCVar10 == (CType *)0x0) || ((pCVar10->info & 0xf0000000) != 0xb0000000))
            goto LAB_0015a7b2;
            TVar5 = lj_ir_kgc(J,o,IRT_STR);
            (J->fold).ins.field_0.ot = 0x884;
            (J->fold).ins.field_0.op1 = IVar17;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
            lj_opt_fold(J);
            pCVar19 = local_78;
            pCVar10 = local_78->tab + (ushort)pCVar10->info;
            uVar22 = lj_ir_kint(J,local_3c);
          }
        }
        else {
          pCVar10 = pCVar10 + 0x11;
          uVar22 = 0;
        }
      }
    }
    local_58[uVar12] = &pCVar10->info;
    (&local_80)[uVar12] = uVar22;
    bVar24 = uVar12 == 0;
    uVar12 = uVar12 + 1;
  } while (bVar24);
  if ((local_6c != 5) && (local_6c != 8)) {
    TVar5 = 0;
    if ((local_80 != 0) &&
       (((local_7c != 0 && (uVar22 = *local_58[0], TVar5 = 0, uVar22 < 0x10000000)) &&
        (uVar15 = *local_58[1], uVar15 < 0x10000000)))) {
      if ((((uVar22 >> 0x17 & 1) == 0) || (local_58[0][1] != 8)) &&
         (((uVar15 >> 0x17 & 1) == 0 || (local_58[1][1] != 8)))) {
        uVar3 = 0x15;
        iVar18 = 0xb;
        if (((9 < local_6c) || (((uVar15 | uVar22) >> 0x1a & 1) != 0)) ||
           ((local_58[0][1] != 4 || (local_58[1][1] != 4)))) goto LAB_0015a2e9;
        if ((((uVar15 ^ uVar22) >> 0x17 & 1) == 0) ||
           ((-1 < (short)local_7c && (-1 < (J->cur).ir[local_7c & 0x7fff].i)))) {
          uVar3 = ((uVar22 >> 0x17 & 1) != 0) + 0x13;
        }
        else {
          if (((short)local_80 < 0) || ((J->cur).ir[local_80 & 0x7fff].i < 0)) goto LAB_0015a2e9;
          uVar3 = ((uVar15 >> 0x17 & 1) != 0) + 0x13;
        }
      }
      else {
        uVar3 = 0x16;
        iVar18 = 0xc;
LAB_0015a2e9:
        lVar20 = 0;
        do {
          uVar22 = (&local_80)[lVar20];
          uVar15 = uVar22 >> 0x18 & 0x1f;
          if (uVar15 - 0xd < 2) {
            uVar13 = (short)uVar15 + uVar3 * 0x20 + 0x1000;
LAB_0015a33b:
            (local_68->fold).ins.field_0.ot = uVar3 + 0x5900;
            (local_68->fold).ins.field_0.op1 = (IRRef1)uVar22;
            (local_68->fold).ins.field_0.op2 = uVar13;
            TVar5 = lj_opt_fold(local_68);
            (&local_80)[lVar20] = TVar5;
          }
          else if (1 < uVar15 - 0x15) {
            uVar13 = ((ushort)(*local_58[lVar20] >> 0xc) & 0x800 | uVar3 * 0x20) ^ 0x813;
            goto LAB_0015a33b;
          }
          J = local_68;
          lVar20 = lVar20 + 1;
        } while (lVar20 == 1);
        if (9 < local_6c) {
          (local_68->fold).ins.field_0.ot = (short)(local_6c << 8) + uVar3 + 0x1f00;
          (local_68->fold).ins.field_0.op1 = (IRRef1)local_80;
          (local_68->fold).ins.field_0.op2 = (IRRef1)local_7c;
          TVar5 = lj_opt_fold(local_68);
          TVar7 = lj_ir_kint(J,iVar18);
          (J->fold).ins.field_0.ot = 0x528a;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
          TVar5 = lj_opt_fold(J);
          goto LAB_0015a442;
        }
      }
      uVar13 = 0x800;
      if (local_6c != 4) {
        uVar14 = (ushort)(local_6c != 6) * 0x200;
        uVar13 = uVar14 + 0x400;
        if ((uVar3 & 0xfffd) != 0x14) {
          uVar13 = uVar14;
        }
      }
      (J->fold).ins.field_0.ot = uVar13 | uVar3 | 0x80;
      (J->fold).ins.field_0.op1 = (IRRef1)local_80;
      (J->fold).ins.field_0.op2 = (IRRef1)local_7c;
      J->postproc = LJ_POST_FIXGUARD;
      TVar5 = 0x2007ffd;
    }
LAB_0015a442:
    uVar22 = local_80;
    if (TVar5 != 0) goto LAB_0015a750;
    TVar7 = 0;
    TVar5 = 0;
    if ((local_80 != 0) && (local_7c != 0)) {
      pCVar19 = (CTState *)(ulong)J[-1].bpropcache[0xc].mode;
      uVar15 = *local_58[0];
      TVar5 = TVar7;
      if ((uVar15 & 0xf0000000) == 0x20000000 || (uVar15 & 0xfc000000) == 0x30000000) {
        if (((0xb < local_6c) || ((0x8d0U >> (local_6c & 0x1f) & 1) == 0)) ||
           ((*local_58[1] & 0xf0000000) != 0x20000000 && (*local_58[1] & 0xfc000000) != 0x30000000))
        {
          if (((local_6c & 0xfffffffe) == 10) && (puVar23 = local_58[0], *local_58[1] < 0x10000000))
          goto LAB_0015a5f1;
          goto LAB_0015a743;
        }
        IVar17 = (IRRef1)local_80;
        IVar21 = (IRRef1)local_7c;
        if (local_6c == 4) {
          uVar3 = 0x889;
        }
        else {
          if (local_6c == 0xb) {
            CVar6 = lj_ctype_size(pCVar19,uVar15 & 0xffff);
            if ((CVar6 ^ CVar6 - 1) <= CVar6 - 1) goto LAB_0015a743;
            (J->fold).ins.field_0.ot = 0x2a15;
            (J->fold).ins.field_0.op1 = IVar17;
            (J->fold).ins.field_0.op2 = IVar21;
            TVar5 = lj_opt_fold(J);
            iVar18 = 0x1f;
            if (CVar6 != 0) {
              for (; CVar6 >> iVar18 == 0; iVar18 = iVar18 + -1) {
              }
            }
            TVar7 = lj_ir_kint(J,iVar18);
            (J->fold).ins.field_0.ot = 0x2615;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
            TVar5 = lj_opt_fold(J);
            (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d5;
            goto LAB_0015a739;
          }
          uVar3 = (ushort)(local_6c != 6) << 9 | 0x489;
        }
        (J->fold).ins.field_0.ot = uVar3;
        (J->fold).ins.field_0.op1 = IVar17;
        (J->fold).ins.field_0.op2 = IVar21;
        J->postproc = LJ_POST_FIXGUARD;
        TVar5 = 0x2007ffd;
      }
      else {
        if ((0xfffffff < uVar15 || local_6c != 10) ||
           ((*local_58[1] & 0xf0000000) != 0x20000000 && (*local_58[1] & 0xfc000000) != 0x30000000))
        goto LAB_0015a743;
        local_80 = local_7c;
        local_7c = uVar22;
        puVar23 = local_58[1];
LAB_0015a5f1:
        uVar22 = local_7c;
        uVar15 = local_7c >> 0x18 & 0x1f;
        CVar6 = lj_ctype_size(pCVar19,(uint)(ushort)*puVar23);
        J = local_68;
        if (uVar15 - 0xd < 2) {
          uVar3 = (ushort)uVar15 | 0x12a0;
LAB_0015a67d:
          (local_68->fold).ins.field_0.ot = 0x5915;
          (local_68->fold).ins.field_0.op1 = (IRRef1)uVar22;
          (local_68->fold).ins.field_0.op2 = uVar3;
          uVar22 = lj_opt_fold(local_68);
        }
        else if (1 < uVar15 - 0x15) {
          uVar3 = (ushort)(uVar22 >> 0xd) & 0x800 | 0x2b3;
          goto LAB_0015a67d;
        }
        TVar5 = lj_ir_kint64(J,(ulong)CVar6);
        (J->fold).ins.field_0.ot = 0x2b15;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar22;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
        TVar5 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = (short)(local_6c << 8) + 0x1f09;
        (J->fold).ins.field_0.op1 = (IRRef1)local_80;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
        TVar5 = lj_opt_fold(J);
        CVar8 = lj_ctype_intern(pCVar19,(ushort)*puVar23 | 0x20030000,8);
        TVar7 = lj_ir_kint(J,CVar8);
        (J->fold).ins.field_0.ot = 0x528a;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar5;
LAB_0015a739:
        TVar5 = lj_opt_fold(J);
      }
    }
LAB_0015a743:
    pCVar19 = local_78;
    if (TVar5 != 0) goto LAB_0015a750;
  }
  if (*J->base == 0) {
LAB_0015a1aa:
    pcVar11 = (cTValue *)0x0;
  }
  else {
    if ((local_60->argv->field_2).it == 0xfffffff5) {
      pGVar9 = argv2cdata(J,*J->base,local_60->argv);
      uVar22 = pCVar19->tab[pGVar9->ctypeid].info;
      uVar15 = (uint)pGVar9->ctypeid;
      if ((uVar22 & 0xf0000000) == 0x20000000) {
        uVar15 = uVar22 & 0xffff;
      }
      pcVar11 = lj_ctype_meta(pCVar19,uVar15,local_60->data);
    }
    else {
      pcVar11 = (cTValue *)0x0;
    }
    if (pcVar11 == (cTValue *)0x0) {
      if ((J->base[1] == 0) || (*(int *)((long)local_60->argv + 0xc) != -0xb)) goto LAB_0015a1aa;
      pGVar9 = argv2cdata(J,J->base[1],local_60->argv + 1);
      uVar22 = local_78->tab[pGVar9->ctypeid].info;
      uVar15 = (uint)pGVar9->ctypeid;
      if ((uVar22 & 0xf0000000) == 0x20000000) {
        uVar15 = uVar22 & 0xffff;
      }
      pcVar11 = lj_ctype_meta(local_78,uVar15,local_60->data);
    }
  }
  if (pcVar11 == (cTValue *)0x0) {
    if (local_60->data != 4) goto LAB_0015a7b2;
    TVar5 = 0x1007ffe;
    if (((local_80 != 0) && (local_7c != 0)) &&
       (*local_58[0] < 0x10000000 != 0xfffffff < *local_58[1])) {
      (J->fold).ins.field_0.ot = 0x889;
      (J->fold).ins.field_0.op1 = (IRRef1)local_80;
      (J->fold).ins.field_0.op2 = (IRRef1)local_7c;
      J->postproc = LJ_POST_FIXGUARD;
      TVar5 = 0x2007ffd;
    }
  }
  else {
    if ((pcVar11->field_2).it != 0xfffffff7) {
LAB_0015a7b2:
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    TVar5 = lj_ir_kgc(J,(GCobj *)(ulong)(pcVar11->u32).lo,IRT_FUNC);
    J->base[-1] = TVar5 | 0x10000;
    local_60->nres = -1;
    TVar5 = 0;
  }
  if (pcVar11 != (cTValue *)0x0) {
    return;
  }
LAB_0015a750:
  *J->base = TVar5;
  if (((J->postproc == LJ_POST_FIXGUARD) &&
      (pTVar2 = J->L->base, ((ulong)*pTVar2 & 0x700000000) == 0x200000000)) &&
     ((-1 < (char)(J->guardemit).irt &&
      (uVar12 = (ulong)*(uint *)((long)pTVar2 + -0xc), (*(uint *)(uVar12 - 4) & 0xfc) < 0xc)))) {
    *(ulong *)&J[-1].penaltyslot = uVar12 - 4;
    J->postproc = LJ_POST_FIXCOMP;
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_cdata_arith(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_cts(J->L);
  MMS mm = (MMS)rd->data;
  TRef sp[2];
  CType *s[2];
  MSize i;
  for (i = 0; i < 2; i++) {
    TRef tr = J->base[i];
    CType *ct = ctype_get(cts, CTID_DOUBLE);
    if (!tr) {
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    } else if (tref_iscdata(tr)) {
      CTypeID id = argv2cdata(J, tr, &rd->argv[i])->ctypeid;
      IRType t;
      ct = ctype_raw(cts, id);
      t = crec_ct2irt(cts, ct);
      if (ctype_isptr(ct->info)) {  /* Resolve pointer or reference. */
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_PTR);
	if (ctype_isref(ct->info)) {
	  ct = ctype_rawchild(cts, ct);
	  t = crec_ct2irt(cts, ct);
	}
      } else if (t == IRT_I64 || t == IRT_U64) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT64);
	lj_needsplit(J);
	goto ok;
      } else if (t == IRT_INT || t == IRT_U32) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT);
	if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
	goto ok;
      } else if (ctype_isfunc(ct->info)) {
	CTypeID id0 = i ? ctype_typeid(cts, s[0]) : 0;
	tr = emitir(IRT(IR_FLOAD, IRT_PTR), tr, IRFL_CDATA_PTR);
	ct = ctype_get(cts,
	  lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR));
	if (i) {
	  s[0] = ctype_get(cts, id0);  /* cts->tab may have been reallocated. */
	}
	goto ok;
      } else {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCcdata)));
      }
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info)) {
	if (t == IRT_CDATA) {
	  tr = 0;
	} else {
	  if (t == IRT_I64 || t == IRT_U64) lj_needsplit(J);
	  tr = emitir(IRT(IR_XLOAD, t), tr, 0);
	}
      }
    } else if (tref_isnil(tr)) {
      if (!(mm == MM_len || mm == MM_eq || mm == MM_lt || mm == MM_le))
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      tr = lj_ir_kptr(J, NULL);
      ct = ctype_get(cts, CTID_P_VOID);
    } else if (tref_isinteger(tr)) {
      ct = ctype_get(cts, CTID_INT32);
    } else if (tref_isstr(tr)) {
      TRef tr2 = J->base[1-i];
      CTypeID id = argv2cdata(J, tr2, &rd->argv[1-i])->ctypeid;
      ct = ctype_raw(cts, id);
      if (ctype_isenum(ct->info)) {  /* Match string against enum constant. */
	GCstr *str = strV(&rd->argv[i]);
	CTSize ofs;
	CType *cct = lj_ctype_getfield(cts, ct, str, &ofs);
	if (cct && ctype_isconstval(cct->info)) {
	  /* Specialize to the name of the enum constant. */
	  emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, str));
	  ct = ctype_child(cts, cct);
	  tr = lj_ir_kint(J, (int32_t)ofs);
	} else {  /* Interpreter will throw or return false. */
	  lj_trace_err(J, LJ_TRERR_BADTYPE);
	}
      } else if (ctype_isptr(ct->info)) {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCstr)));
      } else {
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      }
    } else if (!tref_isnum(tr)) {
      tr = 0;
      ct = ctype_get(cts, CTID_P_VOID);
    }
  ok:
    s[i] = ct;
    sp[i] = tr;
  }
  {
    TRef tr;
    if ((mm == MM_len || mm == MM_concat ||
	 (!(tr = crec_arith_int64(J, sp, s, mm)) &&
	  !(tr = crec_arith_ptr(J, sp, s, mm)))) &&
	!(tr = crec_arith_meta(J, sp, s, cts, rd)))
      return;
    J->base[0] = tr;
    /* Fixup cdata comparisons, too. Avoids some cdata escapes. */
    if (J->postproc == LJ_POST_FIXGUARD && frame_iscont(J->L->base-1) &&
	!irt_isguard(J->guardemit)) {
      const BCIns *pc = frame_contpc(J->L->base-1) - 1;
      if (bc_op(*pc) <= BC_ISNEP) {
	J2G(J)->tmptv.u64 = (uint64_t)(uintptr_t)pc;
	J->postproc = LJ_POST_FIXCOMP;
      }
    }
  }
}